

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform::
IfcCartesianTransformationOperator3DnonUniform(IfcCartesianTransformationOperator3DnonUniform *this)

{
  *(undefined ***)&this->field_0xb8 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(char **)&this->field_0xc8 = "IfcCartesianTransformationOperator3DnonUniform";
  IfcCartesianTransformationOperator3D::IfcCartesianTransformationOperator3D
            (&this->super_IfcCartesianTransformationOperator3D,&PTR_construction_vtable_24__007ad518
            );
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x90 = 0;
  (this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7ad438;
  *(undefined8 *)&this->field_0xb8 = 0x7ad500;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7ad460;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7ad488;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    field_0x68 = 0x7ad4b0;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x88 = 0x7ad4d8;
  this->field_0xa0 = 0;
  (this->Scale3).have = false;
  return;
}

Assistant:

IfcCartesianTransformationOperator3DnonUniform() : Object("IfcCartesianTransformationOperator3DnonUniform") {}